

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O1

string * __thiscall
helics::CommonCore::query_abi_cxx11_
          (string *__return_storage_ptr__,CommonCore *this,string_view target,string_view queryStr,
          HelicsSequencingModes mode)

{
  atomic<int> *paVar1;
  DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  pointer pcVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  future_status fVar7;
  FederateState *fed;
  ulong extraout_RAX;
  string *val;
  char *__s;
  size_t __len2;
  action_t aVar8;
  size_t size;
  byte *__src;
  size_type __rlen;
  size_type __rlen_2;
  future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  queryResult;
  future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  queryResult_1;
  ActionMessage querycmd;
  undefined1 local_188 [8];
  json_value local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  undefined1 local_168 [16];
  undefined1 local_158 [32];
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  local_138;
  undefined1 local_128 [32];
  undefined1 local_108 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8 [3];
  SmallBuffer local_c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  string local_50;
  
  __src = (byte *)queryStr._M_str;
  size = queryStr._M_len;
  __s = target._M_str;
  __len2 = target._M_len;
  if ((this->super_BrokerBase).brokerState._M_i < TERMINATING) {
    aVar8 = cmd_query_ordered;
    if (mode == HELICS_SEQUENCING_MODE_FAST) {
      aVar8 = cmd_query;
    }
    ActionMessage::ActionMessage((ActionMessage *)local_108,aVar8);
    local_108._8_4_ = -0x396fe;
    local_f8[0]._M_allocated_capacity._0_4_ = 0;
    local_c8.bufferSize = size;
    if ((local_c8.heap != __src) && (SmallBuffer::reserve(&local_c8,size), size != 0)) {
      memcpy(local_c8.heap,__src,size);
    }
    LOCK();
    paVar1 = &this->queryCounter;
    iVar5 = (paVar1->super___atomic_base<int>)._M_i;
    (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
    UNLOCK();
    iVar5 = iVar5 + 1;
    local_108._4_4_ = iVar5;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize(&local_68,1);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (local_68.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,0,
               (local_68.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->_M_string_length,__s,__len2);
    if ((__len2 == 4) && (iVar6 = bcmp(__s,"core",4), iVar6 == 0)) {
LAB_002af857:
      quickCoreQueries_abi_cxx11_(__return_storage_ptr__,this,queryStr);
      if (__return_storage_ptr__->_M_string_length == 0) {
        if ((size == 7) && (iVar6 = bcmp(__src,"address",7), iVar6 == 0)) {
          val = getAddress_abi_cxx11_(this);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&local_138,val);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::dump((string_t *)local_128,&local_138,-1,' ',true,hex);
          query_abi_cxx11_();
          goto LAB_002af87a;
        }
        aVar8 = cmd_broker_query_ordered;
        if (mode == HELICS_SEQUENCING_MODE_FAST) {
          aVar8 = cmd_broker_query;
        }
        ActionMessage::setAction((ActionMessage *)local_108,aVar8);
        local_f8[0]._M_allocated_capacity._0_4_ = -0x396fe;
        bVar4 = true;
        bVar3 = false;
      }
      else {
LAB_002af87a:
        bVar4 = false;
        bVar3 = true;
      }
      if (!bVar3) {
        pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar2 != &__return_storage_ptr__->field_2) {
          operator_delete(pcVar2,(__return_storage_ptr__->field_2)._M_allocated_capacity + 1);
        }
      }
      if (!bVar4) goto LAB_002afa53;
    }
    else if ((this->super_BrokerBase).identifier._M_string_length == __len2) {
      if ((__len2 == 0) ||
         (iVar6 = bcmp(__s,(this->super_BrokerBase).identifier._M_dataplus._M_p,__len2), iVar6 == 0)
         ) goto LAB_002af857;
    }
    else if (__len2 == 0) goto LAB_002af857;
    if ((undefined4)local_f8[0]._M_allocated_capacity != -0x396fe) {
      if ((__len2 == 8) && (iVar6 = bcmp(__s,"federate",8), iVar6 == 0)) {
        fed = getFederateAt(this,(LocalFederateId)0x0);
      }
      else {
        fed = getFederate(this,target);
      }
      if ((fed != (FederateState *)0x0) &&
         (local_f8[0]._0_4_ = (fed->global_id)._M_i.gid, mode != HELICS_SEQUENCING_MODE_ORDERED)) {
        federateQuery_abi_cxx11_((string *)local_188,this,fed,queryStr,false);
        iVar6 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_188,"#wait");
        if (iVar6 == 0) {
          this_00 = &this->activeQueries;
          gmlc::concurrency::
          DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::getFuture((DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_168,(int)this_00);
          FederateState::addAction(fed,(ActionMessage *)local_108);
          do {
            local_158._0_8_ = (_Base_ptr)0x32;
            if ((_State_baseV2 *)local_168._0_8_ == (_State_baseV2 *)0x0) {
              std::__throw_future_error(3);
            }
            fVar7 = std::__future_base::_State_baseV2::wait_for<long,std::ratio<1l,1000l>>
                              ((_State_baseV2 *)local_168._0_8_,
                               (duration<long,_std::ratio<1L,_1000L>_> *)local_158);
            if (fVar7 != timeout) {
              if ((fVar7 == ready) || (fVar7 == deferred)) {
                std::
                future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::get(__return_storage_ptr__,
                      (future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_168);
                gmlc::concurrency::
                DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::finishedWithValue(this_00,iVar5);
              }
              else {
                local_158._0_8_ = (_Base_ptr)(local_158 + 0x10);
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_158,"Unexpected Error #13","");
                generateJsonErrorResponse(__return_storage_ptr__,INTERNAL_ERROR,(string *)local_158)
                ;
                if ((_Base_ptr)local_158._0_8_ != (_Base_ptr)(local_158 + 0x10)) {
                  operator_delete((void *)local_158._0_8_,(ulong)(local_158._16_8_ + 1));
                }
              }
              goto LAB_002afced;
            }
            federateQuery_abi_cxx11_(&local_50,this,fed,queryStr,false);
            query_abi_cxx11_();
          } while ((extraout_RAX & 1) != 0);
          gmlc::concurrency::
          DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::finishedWithValue(this_00,iVar5);
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          if (local_188 == (undefined1  [8])&local_178) {
            (__return_storage_ptr__->field_2)._M_allocated_capacity =
                 CONCAT71(local_178._M_allocated_capacity._1_7_,local_178._M_local_buf[0]);
            *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_178._8_8_;
          }
          else {
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_188;
            (__return_storage_ptr__->field_2)._M_allocated_capacity =
                 CONCAT71(local_178._M_allocated_capacity._1_7_,local_178._M_local_buf[0]);
          }
          __return_storage_ptr__->_M_string_length = (size_type)local_180;
          local_180.object = (object_t *)0x0;
          local_178._M_local_buf[0] = '\0';
          local_188 = (undefined1  [8])&local_178;
LAB_002afced:
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_);
          }
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          if (local_188 == (undefined1  [8])&local_178) {
            (__return_storage_ptr__->field_2)._M_allocated_capacity =
                 CONCAT71(local_178._M_allocated_capacity._1_7_,local_178._M_local_buf[0]);
            *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_178._8_8_;
          }
          else {
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_188;
            (__return_storage_ptr__->field_2)._M_allocated_capacity =
                 CONCAT71(local_178._M_allocated_capacity._1_7_,local_178._M_local_buf[0]);
          }
          __return_storage_ptr__->_M_string_length = (size_type)local_180;
          local_180.object = (object_t *)0x0;
          local_178._M_local_buf[0] = '\0';
          local_188 = (undefined1  [8])&local_178;
        }
        if (local_188 != (undefined1  [8])&local_178) {
          operator_delete((void *)local_188,
                          CONCAT71(local_178._M_allocated_capacity._1_7_,local_178._M_local_buf[0])
                          + 1);
        }
        goto LAB_002afa53;
      }
    }
    gmlc::concurrency::
    DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::getFuture((DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_188,(int)&this->activeQueries);
    BrokerBase::addActionMessage(&this->super_BrokerBase,(ActionMessage *)local_108);
    std::future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    get(__return_storage_ptr__,
        (future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        local_188);
    gmlc::concurrency::
    DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::finishedWithValue(&this->activeQueries,iVar5);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_180.object !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_180.object);
    }
LAB_002afa53:
    ActionMessage::~ActionMessage((ActionMessage *)local_108);
    return __return_storage_ptr__;
  }
  if ((__len2 != 4) || (iVar5 = bcmp(__s,"core",4), iVar5 != 0)) {
    if ((this->super_BrokerBase).identifier._M_string_length == __len2) {
      if ((__len2 != 0) &&
         (iVar5 = bcmp(__s,(this->super_BrokerBase).identifier._M_dataplus._M_p,__len2), iVar5 != 0)
         ) goto LAB_002afab3;
    }
    else if (__len2 != 0) goto LAB_002afab3;
  }
  quickCoreQueries_abi_cxx11_((string *)local_108,this,queryStr);
  if (local_108._8_8_ == 0) {
    bVar3 = true;
    if ((size == 4) && (iVar5 = bcmp(__src,"logs",4), iVar5 == 0)) {
      local_188 = (undefined1  [8])((ulong)local_188 & 0xffffffffffffff00);
      local_180.object = (object_t *)0x0;
      local_128._16_8_ = (_Manager_type)0x0;
      local_128._24_8_ = (__pthread_internal_list *)0x0;
      local_128._0_8_ = (void *)0x0;
      local_128._8_8_ = 0;
      loadBasicJsonInfo(this,(json *)local_188,
                        (function<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&,_const_helics::FedInfo_&)>
                         *)local_128);
      if ((_Manager_type)local_128._16_8_ != (_Manager_type)0x0) {
        (*(code *)local_128._16_8_)(local_128,local_128,3);
      }
      bufferToJson(&((this->super_BrokerBase).mLogManager.
                     super___shared_ptr<helics::LogManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    mLogBuffer,(json *)local_188);
      fileops::generateJsonString(__return_storage_ptr__,(json *)local_188,true);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data((data *)local_188);
      goto LAB_002afa8c;
    }
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._0_8_ == local_f8) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT44(local_f8[0]._M_allocated_capacity._4_4_,
                    (undefined4)local_f8[0]._M_allocated_capacity);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_f8[0]._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_108._0_8_;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT44(local_f8[0]._M_allocated_capacity._4_4_,
                    (undefined4)local_f8[0]._M_allocated_capacity);
    }
    __return_storage_ptr__->_M_string_length = local_108._8_8_;
    local_108._8_8_ = 0;
    local_f8[0]._M_allocated_capacity._0_4_ =
         (undefined4)local_f8[0]._M_allocated_capacity & 0xffffff00;
    local_108._0_8_ = local_f8;
LAB_002afa8c:
    bVar3 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._0_8_ != local_f8) {
    operator_delete((void *)local_108._0_8_,
                    CONCAT44(local_f8[0]._M_allocated_capacity._4_4_,
                             (undefined4)local_f8[0]._M_allocated_capacity) + 1);
  }
  if (!bVar3) {
    return __return_storage_ptr__;
  }
LAB_002afab3:
  local_108._0_8_ = local_f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"Core has terminated","");
  generateJsonErrorResponse(__return_storage_ptr__,DISCONNECTED,(string *)local_108);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._0_8_ == local_f8) {
    return __return_storage_ptr__;
  }
  operator_delete((void *)local_108._0_8_,
                  CONCAT44(local_f8[0]._M_allocated_capacity._4_4_,
                           (undefined4)local_f8[0]._M_allocated_capacity) + 1);
  return __return_storage_ptr__;
}

Assistant:

std::string CommonCore::query(std::string_view target,
                              std::string_view queryStr,
                              HelicsSequencingModes mode)
{
    if (getBrokerState() >= BrokerState::TERMINATING) {
        if (target == "core" || target == getIdentifier() || target.empty()) {
            auto res = quickCoreQueries(queryStr);
            if (!res.empty()) {
                return res;
            }
            if (queryStr == "logs") {
                nlohmann::json base;
                loadBasicJsonInfo(base, nullptr);
                bufferToJson(mLogManager->getLogBuffer(), base);
                return fileops::generateJsonString(base);
            }
        }
        return generateJsonErrorResponse(JsonErrorCodes::DISCONNECTED, "Core has terminated");
    }
    ActionMessage querycmd(mode == HELICS_SEQUENCING_MODE_FAST ? CMD_QUERY : CMD_QUERY_ORDERED);
    querycmd.source_id = gDirectCoreId;
    querycmd.dest_id = parent_broker_id;
    querycmd.payload = queryStr;
    auto index = ++queryCounter;
    querycmd.messageID = index;
    querycmd.setStringData(target);

    if (target == "core" || target == getIdentifier() || target.empty()) {
        auto res = quickCoreQueries(queryStr);
        if (!res.empty()) {
            return res;
        }
        if (queryStr == "address") {
            res = generateJsonQuotedString(getAddress());
            return res;
        }
        querycmd.setAction(mode == HELICS_SEQUENCING_MODE_FAST ? CMD_BROKER_QUERY :
                                                                 CMD_BROKER_QUERY_ORDERED);
        querycmd.dest_id = gDirectCoreId;
    }
    if (querycmd.dest_id != gDirectCoreId) {
        // default into a federate query
        auto* fed =
            (target != "federate") ? getFederate(target) : getFederateAt(LocalFederateId(0));
        if (fed != nullptr) {
            querycmd.dest_id = fed->global_id;
            if (mode != HELICS_SEQUENCING_MODE_ORDERED) {
                std::string ret = federateQuery(fed, queryStr, false);
                if (ret != "#wait") {
                    return ret;
                }

                auto queryResult = activeQueries.getFuture(querycmd.messageID);
                fed->addAction(std::move(querycmd));
                std::future_status status = std::future_status::timeout;
                while (status == std::future_status::timeout) {
                    status = queryResult.wait_for(std::chrono::milliseconds(50));
                    switch (status) {
                        case std::future_status::ready:
                        case std::future_status::deferred: {
                            auto qres = queryResult.get();
                            activeQueries.finishedWithValue(index);
                            return qres;
                        }
                        case std::future_status::timeout: {  // federate query may need to wait or
                                                             // can get the result now
                            ret = federateQuery(fed,
                                                queryStr,
                                                mode == HELICS_SEQUENCING_MODE_ORDERED);
                            if (ret != "#wait") {
                                activeQueries.finishedWithValue(index);
                                return ret;
                            }
                        } break;
                        default:
                            status = std::future_status::ready;  // LCOV_EXCL_LINE
                    }
                }
                return generateJsonErrorResponse(JsonErrorCodes::INTERNAL_ERROR,
                                                 "Unexpected Error #13");  // LCOV_EXCL_LINE
            }
        }
    }

    auto queryResult = activeQueries.getFuture(querycmd.messageID);
    addActionMessage(std::move(querycmd));
    auto ret = queryResult.get();
    activeQueries.finishedWithValue(index);
    return ret;
}